

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dep_for_basicchild_boostfunc.cpp
# Opt level: O0

void f(int *i)

{
  ostream *poVar1;
  int *in_RDI;
  A *this;
  rep_conflict rVar2;
  scoped_lock l_1;
  A a;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffff38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff48;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff50;
  int n;
  duration<double,_std::ratio<1L,_1L>_> local_68 [2];
  A local_58;
  undefined8 local_38;
  rep local_30;
  duration<double,_std::ratio<1L,_1L>_> local_28 [4];
  int *local_8;
  
  local_8 = in_RDI;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f begin: ");
  local_38 = std::chrono::_V2::system_clock::now();
  local_30 = (rep)std::chrono::operator-(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->__d);
  this = (A *)std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_28);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)this);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  n = (int)((ulong)poVar1 >> 0x20);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1247b5);
  A::A(this,n);
  A::do_comp(&local_58);
  A::~A(this);
  *local_8 = 10;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f finish: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_68);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1248c5);
  return;
}

Assistant:

void f(int &i) {  
  LOG("f begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  
  { // This is just used to make a delay
    A a(400);
  
    a.do_comp();
  }
  
  i = 10;
  
  LOG("f finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}